

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processDecimalWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  uchar uVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  undefined1 *puVar5;
  ostream *poVar6;
  char *pcVar7;
  double value;
  ulong tempuLong;
  long tempLong_7;
  uchar byte3;
  uchar byte2;
  uchar byte1;
  ulong tempLong_6;
  ushort ushortOutput;
  ulong tempLong_5;
  short shortOutput;
  long tempLong_4;
  uchar ucharOutput_1;
  ulong tempLong_3;
  char charOutput_1;
  long tempLong_2;
  uchar ucharOutput;
  ulong tempLong_1;
  char charOutput;
  long tempLong;
  float floatOutput;
  double doubleOutput;
  int i;
  int endianIndex;
  int periodIndex;
  int signIndex;
  int quoteIndex;
  int byteCount;
  int length;
  int lineNum_local;
  string *word_local;
  ostream *out_local;
  Binasc *this_local;
  
  iVar3 = std::__cxx11::string::size();
  signIndex = -1;
  periodIndex = -1;
  endianIndex = -1;
  i = -1;
  doubleOutput._4_4_ = -1;
  doubleOutput._0_4_ = 0;
  do {
    if (iVar3 <= doubleOutput._0_4_) {
      if (periodIndex == -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "there must be a quote to signify a decimal number");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 0;
      }
      else if (periodIndex == iVar3 + -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "there must be a decimal number after the quote");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 0;
      }
      else if ((i == -1) && (signIndex == 8)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"only floating-point numbers can use 8 bytes"
                                );
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 0;
      }
      else {
        if ((i != -1) && (signIndex == -1)) {
          signIndex = 4;
        }
        if (i == -1) {
          if (signIndex == -1) {
            if (endianIndex == -1) {
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
              uVar4 = atoi(pcVar7);
              if (uVar4 < 0x100) {
                std::operator<<(out,(uchar)uVar4);
                this_local._4_4_ = 1;
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
                poVar6 = std::operator<<(poVar6," at token: ");
                poVar6 = std::operator<<(poVar6,(string *)word);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cerr,
                                         "Decimal number out of range from 0 to 255");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                this_local._4_4_ = 0;
              }
            }
            else {
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
              iVar3 = atoi(pcVar7);
              if ((iVar3 < 0x80) && (-0x81 < iVar3)) {
                std::operator<<(out,(char)iVar3);
                this_local._4_4_ = 1;
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
                poVar6 = std::operator<<(poVar6," at token: ");
                poVar6 = std::operator<<(poVar6,(string *)word);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cerr,
                                         "Decimal number out of range from -128 to 127");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                this_local._4_4_ = 0;
              }
            }
          }
          else {
            switch(signIndex) {
            case 1:
              if (endianIndex == -1) {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
                iVar3 = atoi(pcVar7);
                std::operator<<(out,(uchar)iVar3);
                this_local._4_4_ = 1;
              }
              else {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
                iVar3 = atoi(pcVar7);
                std::operator<<(out,(char)iVar3);
                this_local._4_4_ = 1;
              }
              break;
            case 2:
              if (endianIndex == -1) {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
                iVar3 = atoi(pcVar7);
                if (doubleOutput._4_4_ == -1) {
                  writeBigEndianUShort(out,(ushort)iVar3);
                }
                else {
                  writeLittleEndianUShort(out,(ushort)iVar3);
                }
                this_local._4_4_ = 1;
              }
              else {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
                iVar3 = atoi(pcVar7);
                if (doubleOutput._4_4_ == -1) {
                  writeBigEndianShort(out,(short)iVar3);
                }
                else {
                  writeLittleEndianShort(out,(short)iVar3);
                }
                this_local._4_4_ = 1;
              }
              break;
            case 3:
              if (endianIndex == -1) {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
                iVar3 = atoi(pcVar7);
                uVar1 = (uchar)((uint)iVar3 >> 0x10);
                uVar2 = (uchar)((uint)iVar3 >> 8);
                if (doubleOutput._4_4_ == -1) {
                  std::operator<<(out,uVar1);
                  std::operator<<(out,uVar2);
                  std::operator<<(out,(uchar)iVar3);
                }
                else {
                  std::operator<<(out,(uchar)iVar3);
                  std::operator<<(out,uVar2);
                  std::operator<<(out,uVar1);
                }
                this_local._4_4_ = 1;
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
                poVar6 = std::operator<<(poVar6," at token: ");
                poVar6 = std::operator<<(poVar6,(string *)word);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cerr,
                                         "negative decimal numbers cannot be stored in 3 bytes");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                this_local._4_4_ = 0;
              }
              break;
            case 4:
              if (endianIndex == -1) {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
                iVar3 = atoi(pcVar7);
                if (doubleOutput._4_4_ == -1) {
                  writeBigEndianULong(out,(long)iVar3);
                }
                else {
                  writeLittleEndianULong(out,(long)iVar3);
                }
                this_local._4_4_ = 1;
              }
              else {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
                iVar3 = atoi(pcVar7);
                if (doubleOutput._4_4_ == -1) {
                  writeBigEndianLong(out,(long)iVar3);
                }
                else {
                  writeLittleEndianLong(out,(long)iVar3);
                }
                this_local._4_4_ = 1;
              }
              break;
            default:
              poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
              poVar6 = std::operator<<(poVar6," at token: ");
              poVar6 = std::operator<<(poVar6,(string *)word);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              poVar6 = std::operator<<((ostream *)&std::cerr,
                                       "invalid byte count specification for decimal number");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              this_local._4_4_ = 0;
            }
          }
        }
        else {
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
          value = atof(pcVar7);
          if (signIndex == 4) {
            if (doubleOutput._4_4_ == -1) {
              writeBigEndianFloat(out,(float)value);
            }
            else {
              writeLittleEndianFloat(out,(float)value);
            }
            this_local._4_4_ = 1;
          }
          else if (signIndex == 8) {
            if (doubleOutput._4_4_ == -1) {
              writeBigEndianDouble(out,value);
            }
            else {
              writeLittleEndianDouble(out,value);
            }
            this_local._4_4_ = 1;
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
            poVar6 = std::operator<<(poVar6," at token: ");
            poVar6 = std::operator<<(poVar6,(string *)word);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "floating-point numbers can be only 4 or 8 bytes");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            this_local._4_4_ = 0;
          }
        }
      }
      return this_local._4_4_;
    }
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)word);
    switch(*puVar5) {
    case 0x27:
      if (periodIndex != -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"extra quote in decimal number");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      periodIndex = doubleOutput._0_4_;
      break;
    default:
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
      poVar6 = std::operator<<(poVar6," at token: ");
      poVar6 = std::operator<<(poVar6,(string *)word);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "Invalid character in decimal number (character number ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,doubleOutput._0_4_);
      poVar6 = std::operator<<(poVar6,")");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      return 0;
    case 0x2d:
      if (endianIndex != -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "cannot have more than two minus signs in number");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      endianIndex = doubleOutput._0_4_;
      if ((doubleOutput._0_4_ == 0) ||
         (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar7 != '\'')) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "minus sign must immediately follow quote mark");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      break;
    case 0x2e:
      if (periodIndex == -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"cannot have decimal marker before quote");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      if (i != -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"extra period in decimal number");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      i = doubleOutput._0_4_;
      break;
    case 0x30:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x39:
      if (periodIndex == -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "cannot have numbers before quote in decimal number");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      break;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x38:
      if ((periodIndex == -1) && (signIndex != -1)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"invalid byte specificaton before quote in ")
        ;
        poVar6 = std::operator<<(poVar6,"decimal number");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      if (periodIndex == -1) {
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)word);
        signIndex = *pcVar7 + -0x30;
      }
      break;
    case 0x55:
    case 0x75:
      if (periodIndex != -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"cannot have endian specified after quote");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      if (doubleOutput._4_4_ != -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
        poVar6 = std::operator<<(poVar6," at token: ");
        poVar6 = std::operator<<(poVar6,(string *)word);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"extra \"u\" in decimal number");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      doubleOutput._4_4_ = doubleOutput._0_4_;
    }
    doubleOutput._0_4_ = doubleOutput._0_4_ + 1;
  } while( true );
}

Assistant:

int Binasc::processDecimalWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int byteCount = -1;              // number of bytes to output
	int quoteIndex = -1;             // index of decimal specifier
	int signIndex = -1;              // index of any sign for number
	int periodIndex = -1;            // index of period for floating point
	int endianIndex = -1;            // index of little endian specifier
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		switch (word[i]) {
			case '\'':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra quote in decimal number" << std::endl;
					return 0;
				} else {
					quoteIndex = i;
				}
				break;
			case '-':
				if (signIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have more than two minus signs in number"
						  << std::endl;
					return 0;
				} else {
					signIndex = i;
				}
				if (i == 0 || word[i-1] != '\'') {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "minus sign must immediately follow quote mark" << std::endl;
					return 0;
				}
				break;
			case '.':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have decimal marker before quote" << std::endl;
					return 0;
				}
				if (periodIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra period in decimal number" << std::endl;
					return 0;
				} else {
					periodIndex = i;
				}
				break;
			case 'u':
			case 'U':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have endian specified after quote" << std::endl;
					return 0;
				}
				if (endianIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra \"u\" in decimal number" << std::endl;
					return 0;
				} else {
					endianIndex = i;
				}
				break;
			case '8':
			case '1': case '2': case '3': case '4':
				if (quoteIndex == -1 && byteCount != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "invalid byte specificaton before quote in "
						  << "decimal number" << std::endl;
					return 0;
				} else if (quoteIndex == -1) {
					byteCount = word[i] - '0';
				}
				break;
			case '0': case '5': case '6': case '7': case '9':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have numbers before quote in decimal number"
						  << std::endl;
					return 0;
				}
				break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Invalid character in decimal number"
						  " (character number " << i <<")" << std::endl;
				return 0;
		}
	}

	// there must be a quote character to indicate a decimal number
	// and there must be a decimal number after the quote
	if (quoteIndex == -1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a quote to signify a decimal number" << std::endl;
		return 0;
	} else if (quoteIndex == length - 1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a decimal number after the quote" << std::endl;
		return 0;
	}

	// 8 byte decimal output can only occur if reading a double number
	if (periodIndex == -1 && byteCount == 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "only floating-point numbers can use 8 bytes" << std::endl;
		return 0;
	}

	// default size for floating point numbers is 4 bytes
	if (periodIndex != -1) {
		if (byteCount == -1) {
			byteCount = 4;
		}
	}

	// process any floating point numbers possibilities
	if (periodIndex != -1) {
		double doubleOutput = atof(&word[quoteIndex+1]);
		float  floatOutput  = (float)doubleOutput;
		switch (byteCount) {
			case 4:
			  if (endianIndex == -1) {
				  writeBigEndianFloat(out, floatOutput);
			  } else {
				  writeLittleEndianFloat(out, floatOutput);
			  }
			  return 1;
			  break;
			case 8:
			  if (endianIndex == -1) {
				  writeBigEndianDouble(out, doubleOutput);
			  } else {
				  writeLittleEndianDouble(out, doubleOutput);
			  }
			  return 1;
			  break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "floating-point numbers can be only 4 or 8 bytes" << std::endl;
				return 0;
		}
	}

	// process any integer decimal number possibilities

	// default integer size is one byte, if size is not specified, then
	// the number must be in the one byte range and cannot overflow
	// the byte if the size of the decimal number is not specified
	if (byteCount == -1) {
		if (signIndex != -1) {
			long tempLong = atoi(&word[quoteIndex + 1]);
			if (tempLong > 127 || tempLong < -128) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from -128 to 127" << std::endl;
				return 0;
			}
			char charOutput = (char)tempLong;
			out << charOutput;
			return 1;
		} else {
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar ucharOutput = (uchar)tempLong;
			if (tempLong > 255) { // || (tempLong < 0)) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from 0 to 255" << std::endl;
				return 0;
			}
			out << ucharOutput;
			return 1;
		}
	}

	// left with an integer number with a specified number of bytes
	switch (byteCount) {
		case 1:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				char charOutput = (char)tempLong;
				out << charOutput;
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				uchar ucharOutput = (uchar)tempLong;
				out << ucharOutput;
				return 1;
			}
			break;
		case 2:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				short shortOutput = (short)tempLong;
				if (endianIndex == -1) {
					writeBigEndianShort(out, shortOutput);
				} else {
					writeLittleEndianShort(out, shortOutput);
				}
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				ushort ushortOutput = (ushort)tempLong;
				if (endianIndex == -1) {
					writeBigEndianUShort(out, ushortOutput);
				} else {
					writeLittleEndianUShort(out, ushortOutput);
				}
				return 1;
			}
			break;
		case 3:
			{
			if (signIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "negative decimal numbers cannot be stored in 3 bytes"
					  << std::endl;
				return 0;
			}
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar byte1 = (uchar)((tempLong & 0x00ff0000) >> 16);
			uchar byte2 = (uchar)((tempLong & 0x0000ff00) >> 8);
			uchar byte3 = (uchar)((tempLong & 0x000000ff));
			if (endianIndex == -1) {
				out << byte1;
				out << byte2;
				out << byte3;
			} else {
				out << byte3;
				out << byte2;
				out << byte1;
			}
			return 1;
			}
			break;
		case 4:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianLong(out, tempLong);
				} else {
					writeLittleEndianLong(out, tempLong);
				}
				return 1;
			} else {
				ulong tempuLong = (ulong)atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianULong(out, tempuLong);
				} else {
					writeLittleEndianULong(out, tempuLong);
				}
				return 1;
			}
			break;
		default:
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "invalid byte count specification for decimal number" << std::endl;
			return 0;
	}
}